

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cc
# Opt level: O2

void __thiscall muduo::LogFile::~LogFile(LogFile *this)

{
  std::unique_ptr<muduo::FileUtil::AppendFile,_std::default_delete<muduo::FileUtil::AppendFile>_>::
  ~unique_ptr(&this->file_);
  std::unique_ptr<muduo::MutexLock,_std::default_delete<muduo::MutexLock>_>::~unique_ptr
            (&this->mutex_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

LogFile::~LogFile() = default;